

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderSharedVarTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::SharedBasicVarCase::init(SharedBasicVarCase *this,EVP_PKEY_CTX *ctx)

{
  RenderContext *renderCtx;
  int iVar1;
  int iVar2;
  char *pcVar3;
  ostream *poVar4;
  ShaderProgram *pSVar5;
  ProgramSources *sources;
  TestError *this_00;
  bool *pbVar6;
  string sStack_2b8;
  undefined1 local_298 [40];
  ProgramSources local_270;
  ostringstream src;
  
  iVar1 = (this->m_workGroupSize).m_data[1] * (this->m_workGroupSize).m_data[2] *
          (this->m_workGroupSize).m_data[0];
  iVar2 = 0xf;
  if (iVar1 < 0xf) {
    iVar2 = iVar1;
  }
  if (this->m_precision == PRECISION_LAST) {
    pbVar6 = SSBOArrayLengthTests::init::arraysSized + 1;
  }
  else {
    pbVar6 = (bool *)glu::getPrecisionName(this->m_precision);
  }
  pcVar3 = glu::getDataTypeName(this->m_basicType);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&src);
  poVar4 = std::operator<<((ostream *)&src,"#version 310 es\n");
  poVar4 = std::operator<<(poVar4,"layout (local_size_x = ");
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  poVar4 = std::operator<<(poVar4,", local_size_y = ");
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  poVar4 = std::operator<<(poVar4,", local_size_z = ");
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  poVar4 = std::operator<<(poVar4,") in;\n");
  poVar4 = std::operator<<(poVar4,
                           "const uint LOCAL_SIZE = gl_WorkGroupSize.x*gl_WorkGroupSize.y*gl_WorkGroupSize.z;\n"
                          );
  poVar4 = std::operator<<(poVar4,"shared ");
  poVar4 = std::operator<<(poVar4,pbVar6);
  poVar4 = std::operator<<(poVar4," ");
  poVar4 = std::operator<<(poVar4,pcVar3);
  poVar4 = std::operator<<(poVar4," s_var;\n");
  poVar4 = std::operator<<(poVar4,"uniform ");
  poVar4 = std::operator<<(poVar4,pbVar6);
  poVar4 = std::operator<<(poVar4," ");
  poVar4 = std::operator<<(poVar4,pcVar3);
  poVar4 = std::operator<<(poVar4," u_val[");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
  poVar4 = std::operator<<(poVar4,"];\n");
  poVar4 = std::operator<<(poVar4,"uniform ");
  poVar4 = std::operator<<(poVar4,pbVar6);
  poVar4 = std::operator<<(poVar4," ");
  poVar4 = std::operator<<(poVar4,pcVar3);
  poVar4 = std::operator<<(poVar4," u_ref[");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
  poVar4 = std::operator<<(poVar4,"];\n");
  poVar4 = std::operator<<(poVar4,"uniform uint u_numIters;\n");
  poVar4 = std::operator<<(poVar4,"layout(binding = 0) buffer Result\n");
  poVar4 = std::operator<<(poVar4,"{\n");
  poVar4 = std::operator<<(poVar4,"\tbool isOk[LOCAL_SIZE];\n");
  poVar4 = std::operator<<(poVar4,"};\n");
  poVar4 = std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<(poVar4,"void main (void)\n");
  poVar4 = std::operator<<(poVar4,"{\n");
  poVar4 = std::operator<<(poVar4,"\tbool allOk = true;\n");
  poVar4 = std::operator<<(poVar4,"\tfor (uint ndx = 0u; ndx < u_numIters; ndx++)\n");
  poVar4 = std::operator<<(poVar4,"\t{\n");
  poVar4 = std::operator<<(poVar4,"\t\tif (ndx == gl_LocalInvocationIndex)\n");
  poVar4 = std::operator<<(poVar4,"\t\t\ts_var = u_val[ndx%uint(u_val.length())];\n");
  poVar4 = std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<(poVar4,"\t\tbarrier();\n");
  poVar4 = std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<(poVar4,"\t\tif (s_var != u_ref[ndx%uint(u_ref.length())])\n");
  poVar4 = std::operator<<(poVar4,"\t\t\tallOk = false;\n");
  poVar4 = std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<(poVar4,"\t\tbarrier();\n");
  poVar4 = std::operator<<(poVar4,"\t}\n");
  poVar4 = std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<(poVar4,"\tisOk[gl_LocalInvocationIndex] = allOk;\n");
  std::operator<<(poVar4,"}\n");
  pSVar5 = (ShaderProgram *)operator_new(0xd0);
  renderCtx = ((this->super_TestCase).m_context)->m_renderCtx;
  memset(&local_270,0,0xac);
  local_270.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_270.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_270.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_270.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_270._193_8_ = 0;
  std::__cxx11::stringbuf::str();
  glu::ComputeSource::ComputeSource((ComputeSource *)local_298,&sStack_2b8);
  sources = glu::ProgramSources::operator<<(&local_270,(ShaderSource *)local_298);
  glu::ShaderProgram::ShaderProgram(pSVar5,renderCtx,sources);
  this->m_program = pSVar5;
  std::__cxx11::string::~string((string *)(local_298 + 8));
  std::__cxx11::string::~string((string *)&sStack_2b8);
  glu::ProgramSources::~ProgramSources(&local_270);
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                  this->m_program);
  pSVar5 = this->m_program;
  if ((pSVar5->m_program).m_info.linkOk != false) {
    iVar2 = std::__cxx11::ostringstream::~ostringstream((ostringstream *)&src);
    return iVar2;
  }
  glu::ShaderProgram::~ShaderProgram(pSVar5);
  operator_delete(pSVar5,0xd0);
  this->m_program = (ShaderProgram *)0x0;
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_270,"Compile failed",(allocator<char> *)local_298);
  tcu::TestError::TestError(this_00,(string *)&local_270);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void SharedBasicVarCase::init (void)
{
	const int			valArrayLength	= de::min<int>(MAX_VALUE_ARRAY_LENGTH, product(m_workGroupSize));
	const char*			precName		= m_precision != glu::PRECISION_LAST ? getPrecisionName(m_precision) : "";
	const char*			typeName		= getDataTypeName(m_basicType);
	std::ostringstream	src;

	src << "#version 310 es\n"
		<< "layout (local_size_x = " << m_workGroupSize[0]
		<< ", local_size_y = " << m_workGroupSize[1]
		<< ", local_size_z = " << m_workGroupSize[2]
		<< ") in;\n"
		<< "const uint LOCAL_SIZE = gl_WorkGroupSize.x*gl_WorkGroupSize.y*gl_WorkGroupSize.z;\n"
		<< "shared " << precName << " " << typeName << " s_var;\n"
		<< "uniform " << precName << " " << typeName << " u_val[" << valArrayLength << "];\n"
		<< "uniform " << precName << " " << typeName << " u_ref[" << valArrayLength << "];\n"
		<< "uniform uint u_numIters;\n"
		<< "layout(binding = 0) buffer Result\n"
		<< "{\n"
		<< "	bool isOk[LOCAL_SIZE];\n"
		<< "};\n"
		<< "\n"
		<< "void main (void)\n"
		<< "{\n"
		<< "	bool allOk = true;\n"
		<< "	for (uint ndx = 0u; ndx < u_numIters; ndx++)\n"
		<< "	{\n"
		<< "		if (ndx == gl_LocalInvocationIndex)\n"
		<< "			s_var = u_val[ndx%uint(u_val.length())];\n"
		<< "\n"
		<< "		barrier();\n"
		<< "\n"
		<< "		if (s_var != u_ref[ndx%uint(u_ref.length())])\n"
		<< "			allOk = false;\n"
		<< "\n"
		<< "		barrier();\n"
		<< "	}\n"
		<< "\n"
		<< "	isOk[gl_LocalInvocationIndex] = allOk;\n"
		<< "}\n";

	DE_ASSERT(!m_program);
	m_program = new ShaderProgram(m_context.getRenderContext(), ProgramSources() << ComputeSource(src.str()));

	m_testCtx.getLog() << *m_program;

	if (!m_program->isOk())
	{
		delete m_program;
		m_program = DE_NULL;
		throw tcu::TestError("Compile failed");
	}
}